

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O0

void feat_compute_utt(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 win,mfcc_t ***feat)

{
  int local_2c;
  int32 i;
  mfcc_t ***feat_local;
  int32 win_local;
  int32 nfr_local;
  mfcc_t **mfc_local;
  feat_t *fcb_local;
  
  for (local_2c = win; local_2c < nfr - win; local_2c = local_2c + 1) {
    (*fcb->compute_feat)(fcb,mfc + local_2c,feat[local_2c - win]);
  }
  if (fcb->lda != (mfcc_t ***)0x0) {
    feat_lda_transform(fcb,feat,nfr + win * -2);
  }
  if (fcb->subvecs != (int32 **)0x0) {
    feat_subvec_project(fcb,feat,nfr + win * -2);
  }
  return;
}

Assistant:

static void
feat_compute_utt(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 win, mfcc_t ***feat)
{
    int32 i;

    cep_dump_dbg(fcb, mfc, nfr, "Incoming features (after padding)");

    /* Create feature vectors */
    for (i = win; i < nfr - win; i++) {
        fcb->compute_feat(fcb, mfc + i, feat[i - win]);
    }

    feat_print_dbg(fcb, feat, nfr - win * 2, "After dynamic feature computation");

    if (fcb->lda) {
        feat_lda_transform(fcb, feat, nfr - win * 2);
        feat_print_dbg(fcb, feat, nfr - win * 2, "After LDA");
    }

    if (fcb->subvecs) {
        feat_subvec_project(fcb, feat, nfr - win * 2);
        feat_print_dbg(fcb, feat, nfr - win * 2, "After subvector projection");
    }
}